

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O3

int Abc_NtkRRProve(Abc_RRMan_t *p)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pFanout;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_30;
  
  pNtk = Abc_NtkDup(p->pWnd);
  if (p->pFanout == (Abc_Obj_t *)0x0) {
    pFanout = (Abc_Obj_t *)0x0;
  }
  else {
    pFanout = (((p->pFanout->field_6).pCopy)->field_6).pCopy;
  }
  Abc_NtkRRUpdate(pNtk,(((p->pNode->field_6).pCopy)->field_6).pCopy,
                  (((p->pFanin->field_6).pCopy)->field_6).pCopy,pFanout);
  iVar1 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar1 == 0) {
    Abc_NtkReassignIds(pNtk);
  }
  pAVar3 = Abc_NtkMiter(p->pWnd,pNtk,1,0,0,0);
  p->pMiter = pAVar3;
  Abc_NtkDelete(pNtk);
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  iVar1 = Abc_NtkMiterProve(&p->pMiter,p->pParams);
  iVar2 = clock_gettime(3,&local_30);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  p->timeProve = p->timeProve + lVar5 + lVar4;
  return (int)(iVar1 == 1);
}

Assistant:

int Abc_NtkRRProve( Abc_RRMan_t * p )
{
    Abc_Ntk_t * pWndCopy;
    int RetValue;
    abctime clk;
//    Abc_NtkShowAig( p->pWnd, 0 );
    pWndCopy = Abc_NtkDup( p->pWnd );
    Abc_NtkRRUpdate( pWndCopy, p->pNode->pCopy->pCopy, p->pFanin->pCopy->pCopy, p->pFanout? p->pFanout->pCopy->pCopy : NULL );
    if ( !Abc_NtkIsDfsOrdered(pWndCopy) )
        Abc_NtkReassignIds(pWndCopy);
    p->pMiter = Abc_NtkMiter( p->pWnd, pWndCopy, 1, 0, 0, 0 );
    Abc_NtkDelete( pWndCopy );
clk = Abc_Clock();
    RetValue  = Abc_NtkMiterProve( &p->pMiter, p->pParams );
p->timeProve += Abc_Clock() - clk;
    if ( RetValue == 1 )
        return 1;
    return 0;
}